

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ContinuousAssignSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ContinuousAssignSymbol,slang::syntax::ExpressionSyntax_const&>
          (BumpAllocator *this,ExpressionSyntax *args)

{
  ContinuousAssignSymbol *pCVar1;
  size_t in_RDI;
  size_t unaff_retaddr;
  ExpressionSyntax *in_stack_00000018;
  ContinuousAssignSymbol *in_stack_00000020;
  
  pCVar1 = (ContinuousAssignSymbol *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  ast::ContinuousAssignSymbol::ContinuousAssignSymbol(in_stack_00000020,in_stack_00000018);
  return pCVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }